

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

unique_ptr<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_> __thiscall
perfetto::TracingService::CreateInstance
          (TracingService *this,
          unique_ptr<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
          *shm_factory,TaskRunner *task_runner)

{
  TracingServiceImpl *this_00;
  pointer *__ptr;
  _Head_base<0UL,_perfetto::SharedMemory::Factory_*,_false> local_28;
  
  this_00 = (TracingServiceImpl *)operator_new(0x228);
  local_28._M_head_impl =
       (shm_factory->_M_t).
       super___uniq_ptr_impl<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::SharedMemory::Factory_*,_std::default_delete<perfetto::SharedMemory::Factory>_>
       .super__Head_base<0UL,_perfetto::SharedMemory::Factory_*,_false>._M_head_impl;
  (shm_factory->_M_t).
  super___uniq_ptr_impl<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::SharedMemory::Factory_*,_std::default_delete<perfetto::SharedMemory::Factory>_>
  .super__Head_base<0UL,_perfetto::SharedMemory::Factory_*,_false>._M_head_impl = (Factory *)0x0;
  TracingServiceImpl::TracingServiceImpl
            (this_00,(unique_ptr<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
                      *)&local_28,task_runner);
  this->_vptr_TracingService = (_func_int **)this_00;
  if (local_28._M_head_impl != (Factory *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Factory[1])();
  }
  return (__uniq_ptr_data<perfetto::TracingService,_std::default_delete<perfetto::TracingService>,_true,_true>
          )(__uniq_ptr_data<perfetto::TracingService,_std::default_delete<perfetto::TracingService>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TracingService> TracingService::CreateInstance(
    std::unique_ptr<SharedMemory::Factory> shm_factory,
    base::TaskRunner* task_runner) {
  return std::unique_ptr<TracingService>(
      new TracingServiceImpl(std::move(shm_factory), task_runner));
}